

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.h
# Opt level: O0

void __thiscall RtMidiError::~RtMidiError(RtMidiError *this)

{
  RtMidiError *this_local;
  
  ~RtMidiError(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~RtMidiError( void ) throw() {}